

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

bool sf::Shader::isGeometryAvailable(void)

{
  TransientContextLock contextLock;
  Lock lock;
  undefined1 in_stack_ffffffffffffffe0;
  byte bVar1;
  undefined1 in_stack_ffffffffffffffe1;
  undefined1 in_stack_ffffffffffffffe2;
  undefined1 in_stack_ffffffffffffffe3;
  undefined4 in_stack_ffffffffffffffe4;
  Mutex *in_stack_ffffffffffffffe8;
  TransientContextLock *in_stack_fffffffffffffff0;
  
  Lock::Lock((Lock *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  if ((isGeometryAvailable::checked & 1U) == 0) {
    isGeometryAvailable::checked = true;
    GlResource::TransientContextLock::TransientContextLock(in_stack_fffffffffffffff0);
    priv::ensureExtensionsInit();
    in_stack_ffffffffffffffe3 = isAvailable();
    if ((bool)in_stack_ffffffffffffffe3) {
      in_stack_ffffffffffffffe1 =
           SF_GLAD_GL_ARB_geometry_shader4 != 0 || SF_GLAD_GL_VERSION_3_2 != 0;
    }
    isGeometryAvailable::available =
         (bool)in_stack_ffffffffffffffe3 &&
         (SF_GLAD_GL_ARB_geometry_shader4 != 0 || SF_GLAD_GL_VERSION_3_2 != 0);
    in_stack_ffffffffffffffe2 = isGeometryAvailable::available;
    GlResource::TransientContextLock::~TransientContextLock
              ((TransientContextLock *)
               CONCAT44(in_stack_ffffffffffffffe4,
                        CONCAT13(in_stack_ffffffffffffffe3,
                                 CONCAT12(isGeometryAvailable::available,
                                          CONCAT11(in_stack_ffffffffffffffe1,
                                                   in_stack_ffffffffffffffe0)))));
  }
  bVar1 = isGeometryAvailable::available;
  Lock::~Lock((Lock *)CONCAT44(in_stack_ffffffffffffffe4,
                               CONCAT13(in_stack_ffffffffffffffe3,
                                        CONCAT12(in_stack_ffffffffffffffe2,
                                                 CONCAT11(in_stack_ffffffffffffffe1,
                                                          isGeometryAvailable::available)))));
  return (bool)(bVar1 & 1);
}

Assistant:

bool Shader::isGeometryAvailable()
{
    Lock lock(isAvailableMutex);

    static bool checked = false;
    static bool available = false;

    if (!checked)
    {
        checked = true;

        TransientContextLock contextLock;

        // Make sure that extensions are initialized
        sf::priv::ensureExtensionsInit();

        available = isAvailable() && (GLEXT_geometry_shader4 || GLEXT_GL_VERSION_3_2);
    }

    return available;
}